

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypesX.hpp
# Opt level: O2

void __thiscall Diligent::InputLayoutDescX::SyncDesc(InputLayoutDescX *this,bool CopyStrings)

{
  pointer pLVar1;
  Uint32 UVar2;
  long lVar3;
  pointer pLVar4;
  long lVar5;
  undefined7 in_register_00000031;
  iterator __begin3;
  pointer pLVar6;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar7;
  
  pLVar6 = (this->Elements).
           super__Vector_base<Diligent::LayoutElement,_std::allocator<Diligent::LayoutElement>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pLVar1 = (this->Elements).
           super__Vector_base<Diligent::LayoutElement,_std::allocator<Diligent::LayoutElement>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar3 = (long)pLVar1 - (long)pLVar6;
  lVar5 = lVar3 % 0x28;
  UVar2 = (Uint32)(lVar3 / 0x28);
  (this->Desc).NumElements = UVar2;
  pLVar4 = (pointer)0x0;
  if (UVar2 != 0) {
    pLVar4 = pLVar6;
  }
  (this->Desc).LayoutElements = pLVar4;
  if ((int)CONCAT71(in_register_00000031,CopyStrings) != 0) {
    for (; pLVar6 != pLVar1; pLVar6 = pLVar6 + 1) {
      pVar7 = std::
              _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              ::_M_emplace<char_const*&>
                        ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          *)&this->StringPool,pLVar6,lVar5);
      lVar5 = pVar7._8_8_;
      pLVar6->HLSLSemantic =
           *(Char **)((long)pVar7.first.
                            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                            ._M_cur.
                            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     + 8);
    }
  }
  return;
}

Assistant:

PipelineResourceLayoutDescX& operator=(const PipelineResourceLayoutDescX& _DescX)
    {
        PipelineResourceLayoutDescX Copy{_DescX};
        std::swap(*this, Copy);
        return *this;
    }